

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

void mips_release(void *ctx)

{
  long lVar1;
  CPUTLBDescFast *fast;
  CPUTLBDesc *desc;
  CPUTLBDescFast *f;
  CPUTLBDesc *d;
  MIPSCPU_conflict5 *cpu;
  TCGContext_conflict5 *tcg_ctx;
  int i;
  void *ctx_local;
  
  lVar1 = *(long *)(*(long *)((long)ctx + 0xa970) + 0x1a0);
  release_common(ctx);
  for (tcg_ctx._4_4_ = 0; tcg_ctx._4_4_ < 4; tcg_ctx._4_4_ = tcg_ctx._4_4_ + 1) {
    g_free(*(gpointer *)(lVar1 + (long)tcg_ctx._4_4_ * 0x2b8 + 0x8490));
    g_free(*(gpointer *)(lVar1 + (long)tcg_ctx._4_4_ * 0x10 + 0x8cc8));
  }
  g_free(*(gpointer *)(lVar1 + 0xcb88));
  g_free(*(gpointer *)(lVar1 + 0xcb90));
  return;
}

Assistant:

static void mips_release(void *ctx)
{
    int i;
    TCGContext *tcg_ctx = (TCGContext *)ctx;
    MIPSCPU *cpu = (MIPSCPU *)tcg_ctx->uc->cpu;
    CPUTLBDesc *d = cpu->neg.tlb.d;
    CPUTLBDescFast *f = cpu->neg.tlb.f;
    CPUTLBDesc *desc;
    CPUTLBDescFast *fast;

    release_common(ctx);
    for (i = 0; i < NB_MMU_MODES; i++) {
        desc = &(d[i]);
        fast = &(f[i]);
        g_free(desc->iotlb);
        g_free(fast->table);
    }

    g_free(cpu->env.mvp);
    g_free(cpu->env.tlb);
}